

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_positional_reference_expression.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::ExpressionBinder::BindPositionalReference
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr,idx_t depth,bool root_expression)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  BaseExpression *this_00;
  InternalException *this_01;
  pointer *__ptr;
  unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
  column;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_48;
  
  this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(expr)->super_BaseExpression;
  BaseExpression::Cast<duckdb::PositionalReferenceExpression>(this_00);
  if (depth == 0) {
    BindContext::PositionToColumn
              ((BindContext *)&stack0xffffffffffffffb8,
               (PositionalReferenceExpression *)&this->binder->bind_context);
    _Var2._M_head_impl = local_48._M_head_impl;
    local_48._M_head_impl = (ParsedExpression *)0x0;
    _Var1._M_head_impl =
         (expr->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (expr->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    (*this->_vptr_ExpressionBinder[5])(__return_storage_ptr__,this,expr,0,(ulong)root_expression);
    if (local_48._M_head_impl != (ParsedExpression *)0x0) {
      (*(code *)(*(__node_base_ptr *)local_48._M_head_impl)[1]._M_nxt)();
    }
    return __return_storage_ptr__;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_48._M_head_impl = (ParsedExpression *)&stack0xffffffffffffffc8;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffffb8,"Positional reference expression could not be bound"
             ,"");
  InternalException::InternalException(this_01,(string *)&stack0xffffffffffffffb8);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BindResult ExpressionBinder::BindPositionalReference(unique_ptr<ParsedExpression> &expr, idx_t depth,
                                                     bool root_expression) {
	auto &ref = expr->Cast<PositionalReferenceExpression>();
	if (depth != 0) {
		throw InternalException("Positional reference expression could not be bound");
	}
	// replace the positional reference with a column
	auto column = binder.bind_context.PositionToColumn(ref);
	expr = std::move(column);
	return BindExpression(expr, depth, root_expression);
}